

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

PageAllocation * __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::AllocAllocation(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *this,size_t pageCount)

{
  code *pcVar1;
  bool bVar2;
  PageAllocatorBaseCommon *pPVar3;
  undefined4 *puVar4;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *local_30;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  PageAllocation *pageAllocation;
  size_t pageCount_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_local;
  
  pageAllocation = (PageAllocation *)pageCount;
  pageCount_local = (size_t)this;
  if (this->maxAllocPageCount < pageCount) {
    local_30 = (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
               AllocSegment(this,pageCount);
    if (local_30 == (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
      return (PageAllocation *)0x0;
    }
    segment = (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
              SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                        ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)local_30);
    pPVar3 = (PageAllocatorBaseCommon *)
             SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount
                       (&local_30->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
    (segment->super_SegmentBaseCommon).allocator = pPVar3;
  }
  else {
    if (0xffffffff < pageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x495,"(pageCount <= (2147483647 *2U +1U))","pageCount <= UINT_MAX");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    segment = (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)
              AllocPages(this,(uint)pageAllocation,&local_30);
    if (segment == (SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)0x0) {
      return (PageAllocation *)0x0;
    }
    (segment->super_SegmentBaseCommon).allocator = (PageAllocatorBaseCommon *)pageAllocation;
  }
  segment->secondaryAllocator = (SecondaryAllocator *)local_30;
  return (PageAllocation *)segment;
}

Assistant:

PageAllocation *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::AllocAllocation(size_t pageCount)
{
    PageAllocation * pageAllocation;
    TSegment * segment;
    if (pageCount > this->maxAllocPageCount)
    {
        // We need some space reserved for secondary allocations
        segment = AllocSegment(pageCount);
        if (segment == nullptr)
        {
            return nullptr;
        }
        pageAllocation = (PageAllocation *)segment->GetAddress();
        pageAllocation->pageCount = segment->GetAvailablePageCount();
    }
    else
    {
        Assert(pageCount <= UINT_MAX);
        pageAllocation = (PageAllocation *)AllocPages((uint)pageCount, (TPageSegment **)&segment);
        if (pageAllocation == nullptr)
        {
            return nullptr;
        }
        pageAllocation->pageCount = pageCount;
    }
    pageAllocation->segment = segment;

    return pageAllocation;
}